

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit_p.cpp
# Opt level: O0

int effectiveTextMargin(int defaultMargin,SideWidgetEntryList *widgets,
                       SideWidgetParameters *parameters)

{
  bool bVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  difference_type dVar4;
  long in_RDX;
  int in_EDI;
  difference_type visibleSideWidgetCount;
  vector<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
  *in_stack_ffffffffffffffd0;
  vector<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
  *in_stack_ffffffffffffffd8;
  int local_4;
  
  bVar1 = std::
          vector<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
          ::empty(in_stack_ffffffffffffffd8);
  local_4 = in_EDI;
  if (!bVar1) {
    cVar2 = std::
            vector<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
            ::begin(in_stack_ffffffffffffffd0);
    cVar3 = std::
            vector<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
            ::end(in_stack_ffffffffffffffd0);
    dVar4 = std::
            count_if<__gnu_cxx::__normal_iterator<QLineEditPrivate::SideWidgetEntry_const*,std::vector<QLineEditPrivate::SideWidgetEntry,std::allocator<QLineEditPrivate::SideWidgetEntry>>>,effectiveTextMargin(int,std::vector<QLineEditPrivate::SideWidgetEntry,std::allocator<QLineEditPrivate::SideWidgetEntry>>const&,QLineEditPrivate::SideWidgetParameters_const&)::__0>
                      (cVar2._M_current,cVar3._M_current);
    local_4 = in_EDI + (*(int *)(in_RDX + 0xc) + *(int *)(in_RDX + 4)) * (int)dVar4;
  }
  return local_4;
}

Assistant:

static int effectiveTextMargin(int defaultMargin, const QLineEditPrivate::SideWidgetEntryList &widgets,
                               const QLineEditPrivate::SideWidgetParameters &parameters)
{
    if (widgets.empty())
        return defaultMargin;

    const auto visibleSideWidgetCount = std::count_if(widgets.begin(), widgets.end(),
                             [](const QLineEditPrivate::SideWidgetEntry &e) {
#if QT_CONFIG(toolbutton) && QT_CONFIG(animation)
        // a button that's fading out doesn't get any space
        if (auto* iconButton = qobject_cast<QLineEditIconButton*>(e.widget))
            return iconButton->needsSpace();

#endif
        return e.widget->isVisibleTo(e.widget->parentWidget());
    });

    return defaultMargin + (parameters.margin + parameters.widgetWidth) * visibleSideWidgetCount;
}